

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qocspresponse.cpp
# Opt level: O0

size_t qHash(QOcspResponse *response,size_t seed)

{
  long lVar1;
  bool bVar2;
  QOcspResponsePrivate *this;
  result_type rVar3;
  long in_FS_OFFSET;
  size_t hash;
  QOcspResponsePrivate *d;
  QHashCombine hasher;
  QSslCertificate *in_stack_ffffffffffffffb8;
  QSslCertificate *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = QSharedDataPointer<QOcspResponsePrivate>::data
                   ((QSharedDataPointer<QOcspResponsePrivate> *)0x38a67a);
  rVar3 = QtPrivate::QHashCombine::operator()
                    ((QHashCombine *)this,in_stack_ffffffffffffffc8,(int *)in_stack_ffffffffffffffc0
                    );
  rVar3 = QtPrivate::QHashCombine::operator()
                    ((QHashCombine *)this,rVar3,(int *)in_stack_ffffffffffffffc0);
  bVar2 = QSslCertificate::isNull(in_stack_ffffffffffffffb8);
  if (!bVar2) {
    rVar3 = QtPrivate::QHashCombine::operator()
                      ((QHashCombine *)this,rVar3,in_stack_ffffffffffffffc0);
  }
  bVar2 = QSslCertificate::isNull(in_stack_ffffffffffffffb8);
  if (!bVar2) {
    rVar3 = QtPrivate::QHashCombine::operator()
                      ((QHashCombine *)this,rVar3,in_stack_ffffffffffffffc0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return rVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t qHash(const QOcspResponse &response, size_t seed) noexcept
{
    const QOcspResponsePrivate *d = response.d.data();
    Q_ASSERT(d);

    QtPrivate::QHashCombine hasher;
    size_t hash = hasher(seed, int(d->certificateStatus));
    hash = hasher(hash, int(d->revocationReason));
    if (!d->signerCert.isNull())
        hash = hasher(hash, d->signerCert);
    if (!d->subjectCert.isNull())
        hash = hasher(hash, d->subjectCert);

    return hash;
}